

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall myGame::Game::Game(Game *this,int height,int weight)

{
  int i;
  char **ppcVar1;
  long lVar2;
  int j;
  long lVar3;
  int iVar4;
  Game *this_00;
  bool bVar5;
  Point local_50;
  Snake local_48;
  
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lr_window).x = 0;
  (this->lr_window).y = 0;
  this->W = weight;
  this->H = height;
  local_50.x = 0;
  local_50.y = 0;
  Snake::Snake(&local_48,&local_50,&Point::dir_left);
  Snake::operator=(&this->snake,&local_48);
  std::_Vector_base<Object_*,_std::allocator<Object_*>_>::~_Vector_base
            (&local_48.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>);
  this_00 = (Game *)(ulong)(uint)this->W;
  ppcVar1 = getMap(this->W,this->H);
  this->map = ppcVar1;
  iVar4 = 3000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    getFood(this_00);
  }
  this->points = 0;
  for (lVar2 = 0; lVar2 < this->H; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < this->W; lVar3 = lVar3 + 1) {
      this->map[lVar2][lVar3] = '.';
    }
  }
  return;
}

Assistant:

Game::Game(int height, int weight){
	W = weight;
	H = height;
	snake = Snake(Point(0, 0), Point::dir_left);
	map = getMap(W, H);
	for (int i = 0; i < 3000; i++){
		getFood();
	}
	points = 0;
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
			// map2[i][j] = map[i][j];
		}
	}
}